

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APIntOps::RoundingSDiv(APIntOps *this,APInt *A,APInt *B,Rounding RM)

{
  bool bVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  APInt AVar4;
  APInt local_70;
  APInt local_60;
  undefined4 local_4c;
  undefined1 local_48 [8];
  APInt Rem;
  APInt Quo;
  Rounding RM_local;
  APInt *B_local;
  APInt *A_local;
  undefined8 uVar3;
  
  if (RM != DOWN) {
    if (RM == TOWARD_ZERO) {
      AVar4 = APInt::sdiv((APInt *)this,A);
      uVar3 = AVar4._8_8_;
      goto LAB_00298552;
    }
    if (RM != UP) {
      llvm_unreachable_internal
                ("Unknown APInt::Rounding enum",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0xa94);
    }
  }
  APInt::APInt((APInt *)&Rem.BitWidth);
  APInt::APInt((APInt *)local_48);
  APInt::sdivrem(A,B,(APInt *)&Rem.BitWidth,(APInt *)local_48);
  bVar1 = APInt::operator==((APInt *)local_48,0);
  if (bVar1) {
    APInt::APInt((APInt *)this,(APInt *)&Rem.BitWidth);
  }
  else if (RM == DOWN) {
    bVar1 = APInt::isNegative((APInt *)local_48);
    bVar2 = APInt::isNegative(B);
    if (bVar1 == bVar2) {
      APInt::APInt((APInt *)this,(APInt *)&Rem.BitWidth);
    }
    else {
      APInt::APInt(&local_60,(APInt *)&Rem.BitWidth);
      llvm::operator-((llvm *)this,&local_60,1);
      APInt::~APInt(&local_60);
    }
  }
  else {
    bVar1 = APInt::isNegative((APInt *)local_48);
    bVar2 = APInt::isNegative(B);
    if (bVar1 == bVar2) {
      APInt::APInt(&local_70,(APInt *)&Rem.BitWidth);
      llvm::operator+((llvm *)this,&local_70,1);
      APInt::~APInt(&local_70);
    }
    else {
      APInt::APInt((APInt *)this,(APInt *)&Rem.BitWidth);
    }
  }
  local_4c = 1;
  APInt::~APInt((APInt *)local_48);
  APInt::~APInt((APInt *)&Rem.BitWidth);
  uVar3 = extraout_RDX;
LAB_00298552:
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt llvm::APIntOps::RoundingSDiv(const APInt &A, const APInt &B,
                                   APInt::Rounding RM) {
  switch (RM) {
  case APInt::Rounding::DOWN:
  case APInt::Rounding::UP: {
    APInt Quo, Rem;
    APInt::sdivrem(A, B, Quo, Rem);
    if (Rem == 0)
      return Quo;
    // This algorithm deals with arbitrary rounding mode used by sdivrem.
    // We want to check whether the non-integer part of the mathematical value
    // is negative or not. If the non-integer part is negative, we need to round
    // down from Quo; otherwise, if it's positive or 0, we return Quo, as it's
    // already rounded down.
    if (RM == APInt::Rounding::DOWN) {
      if (Rem.isNegative() != B.isNegative())
        return Quo - 1;
      return Quo;
    }
    if (Rem.isNegative() != B.isNegative())
      return Quo;
    return Quo + 1;
  }
  // Currently sdiv rounds twards zero.
  case APInt::Rounding::TOWARD_ZERO:
    return A.sdiv(B);
  }
  llvm_unreachable("Unknown APInt::Rounding enum");
}